

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CGL::Application::mouse1_dragged(Application *this,float x,float y)

{
  ulong uVar1;
  Scene *this_00;
  ulong uVar2;
  Vector2D VVar3;
  float fVar4;
  float fVar5;
  char cVar6;
  bool bVar7;
  ostream *poVar8;
  Application *this_01;
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Matrix4x4 local_98;
  
  auVar9._4_60_ = in_register_00001204;
  auVar9._0_4_ = x;
  if (this->mode == RENDER_MODE) {
    auVar10 = vinsertps_avx(auVar9._0_16_,ZEXT416((uint)((float)this->screenH - y)),0x10);
    VVar3 = (Vector2D)vcvtps2pd_avx(auVar10);
    this->renderer->cell_br = VVar3;
  }
  else {
    fVar4 = x - this->mouseX;
    fVar5 = y - this->mouseY;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"dx, dy: ",8);
    poVar8 = std::ostream::_M_insert<double>((double)fVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    poVar8 = std::ostream::_M_insert<double>((double)fVar5);
    cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    this_01 = (Application *)(ulong)(uint)(int)cVar6;
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((this->mode != EDIT_MODE) || (bVar7 = GLScene::Scene::has_selection(this->scene), !bVar7)) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = this->screenH;
      auVar10 = vunpcklps_avx(auVar10,ZEXT816(0x4530000043300000));
      auVar10 = vsubpd_avx(auVar10,_DAT_001dfc60);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = this->screenW;
      auVar11 = vunpcklps_avx(auVar11,ZEXT816(0x4530000043300000));
      auVar11 = vsubpd_avx(auVar11,_DAT_001dfc60);
      CGL::Camera::rotate_by
                ((3.141592653589793 / (auVar10._0_8_ + auVar10._8_8_)) * (double)-fVar5,
                 (3.141592653589793 / (auVar11._0_8_ + auVar11._8_8_)) * (double)-fVar4);
      return;
    }
    uVar1 = this->screenW;
    this_00 = this->scene;
    uVar2 = this->screenH;
    get_world_to_3DH(&local_98,this_01);
    GLScene::Scene::drag_selection
              (this_00,(fVar4 + fVar4) / (float)uVar1,(fVar5 * -2.0) / (float)uVar2,&local_98);
  }
  return;
}

Assistant:

void Application::mouse1_dragged(float x, float y) {
  if (mode == RENDER_MODE) {
    renderer->cell_br = Vector2D(x, screenH - y);
    return;
  }
  float dx = (x - mouseX);
  float dy = (y - mouseY);

  cout << "dx, dy: " << dx << ", " << dy << endl;

  if (mode == EDIT_MODE && scene->has_selection()) {
    scene->drag_selection(2 * dx / screenW, 2 * -dy / screenH,
                          get_world_to_3DH());
  } else {
    camera.rotate_by(-dy * (PI / screenH), -dx * (PI / screenW));
  }
}